

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall cmInstallScriptGenerator::GenerateScript(cmInstallScriptGenerator *this,ostream *os)

{
  cmScriptGeneratorIndent *this_00;
  char *component;
  ostream *poVar1;
  cmScriptGeneratorIndent local_54;
  cmScriptGeneratorIndent local_50 [4];
  undefined1 local_40 [8];
  string component_test;
  Indent indent;
  ostream *os_local;
  cmInstallScriptGenerator *this_local;
  
  this_00 = (cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc);
  cmScriptGeneratorIndent::cmScriptGeneratorIndent(this_00);
  component = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::CreateComponentTest_abi_cxx11_
            ((string *)local_40,&this->super_cmInstallGenerator,component);
  poVar1 = ::operator<<(os,this_00);
  poVar1 = std::operator<<(poVar1,"if(");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  std::operator<<(poVar1,")\n");
  if ((this->Code & 1U) == 0) {
    local_54 = cmScriptGeneratorIndent::Next
                         ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
    poVar1 = ::operator<<(os,&local_54);
    poVar1 = std::operator<<(poVar1,"include(\"");
    poVar1 = std::operator<<(poVar1,(string *)&this->Script);
    std::operator<<(poVar1,"\")\n");
  }
  else {
    local_50[0] = cmScriptGeneratorIndent::Next
                            ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
    poVar1 = ::operator<<(os,local_50);
    poVar1 = std::operator<<(poVar1,(string *)&this->Script);
    std::operator<<(poVar1,"\n");
  }
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc));
  std::operator<<(poVar1,"endif()\n\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScript(std::ostream& os)
{
  Indent indent;
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str());
  os << indent << "if(" << component_test << ")\n";

  if(this->Code)
    {
    os << indent.Next() << this->Script << "\n";
    }
  else
    {
    os << indent.Next() << "include(\"" << this->Script << "\")\n";
    }

  os << indent << "endif()\n\n";
}